

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

void __thiscall IMLE::Param::display(Param *this,ostream *out)

{
  long *plVar1;
  ostream *poVar2;
  bool bVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"d= ",3);
  plVar1 = (long *)std::ostream::operator<<(out,this->d);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"D= ",3);
  plVar1 = (long *)std::ostream::operator<<(out,this->D);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"alpha= ",7);
  poVar2 = std::ostream::_M_insert<double>(this->alpha);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Psi0= ",6);
  poVar2 = Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Psi0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"sigma0= ",8);
  poVar2 = std::ostream::_M_insert<double>(this->sigma0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"wsigma= ",8);
  poVar2 = std::ostream::_M_insert<double>(this->wsigma);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"wSigma= ",8);
  poVar2 = std::ostream::_M_insert<double>(this->wSigma);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"wNu= ",5);
  poVar2 = std::ostream::_M_insert<double>(this->wNu);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"wLambda= ",9);
  poVar2 = std::ostream::_M_insert<double>(this->wLambda);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"wpsi= ",6);
  poVar2 = std::ostream::_M_insert<double>(this->wpsi);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"wPsi= ",6);
  poVar2 = std::ostream::_M_insert<double>(this->wPsi);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"p0= ",4);
  poVar2 = std::ostream::_M_insert<double>(this->p0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"nOutliers= ",0xb);
  plVar1 = (long *)std::ostream::operator<<(out,this->nOutliers);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"multiValuedSignificance= ",0x19);
  poVar2 = std::ostream::_M_insert<double>(this->multiValuedSignificance);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"nSolMin= ",9);
  plVar1 = (long *)std::ostream::operator<<(out,this->nSolMin);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"nSolMax= ",9);
  plVar1 = (long *)std::ostream::operator<<(out,this->nSolMax);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"iterMax= ",9);
  plVar1 = (long *)std::ostream::operator<<(out,this->iterMax);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"defaultSave= ",0xd);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(this->defaultSave)._M_dataplus._M_p,(this->defaultSave)._M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"saveOnExit= ",0xc);
  bVar3 = SUB81(out,0);
  poVar2 = std::ostream::_M_insert<bool>(bVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"accelerated= ",0xd);
  poVar2 = std::ostream::_M_insert<bool>(bVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + bVar3);
  std::ostream::put(bVar3);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::Param::display(std::ostream &out) const
{
    out << EXPAND(d) << std::endl;
    out << EXPAND(D) << std::endl;

    out << EXPAND(alpha) << std::endl;

    out << EXPAND(Psi0) << std::endl;
    out << EXPAND(sigma0) << std::endl;

    out << EXPAND(wsigma) << std::endl;
    out << EXPAND(wSigma) << std::endl;
    out << EXPAND(wNu) << std::endl;
    out << EXPAND(wLambda) << std::endl;
    out << EXPAND(wpsi) << std::endl;
    out << EXPAND(wPsi) << std::endl;

    out << EXPAND(p0) << std::endl;
    out << EXPAND(nOutliers) << std::endl;

    out << EXPAND(multiValuedSignificance) << std::endl;
    out << EXPAND(nSolMin) << std::endl;
    out << EXPAND(nSolMax) << std::endl;
    out << EXPAND(iterMax) << std::endl;

    out << EXPAND(defaultSave) << std::endl;
    out << EXPAND(saveOnExit) << std::endl;
    out << EXPAND(accelerated) << std::endl;

    out << std::endl << std::endl;
}